

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.c
# Opt level: O3

size_t FSE_buildCTable_wksp
                 (FSE_CTable *ct,short *normalizedCounter,uint maxSymbolValue,uint tableLog,
                 void *workSpace,size_t wkspSize)

{
  short sVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  FSE_CTable FVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  FSE_CTable FVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  uint local_438 [258];
  
  uVar4 = 1 << ((byte)tableLog & 0x1f);
  uVar13 = 1;
  if (tableLog != 0) {
    uVar13 = (ulong)(uVar4 >> 1);
  }
  if (wkspSize >> ((byte)tableLog & 0x3f) == 0) {
    sVar5 = 0xffffffffffffffd4;
  }
  else {
    uVar2 = uVar4 - 1;
    *(short *)ct = (short)tableLog;
    *(short *)((long)ct + 2) = (short)maxSymbolValue;
    local_438[0] = 0;
    uVar12 = maxSymbolValue + 1;
    uVar8 = uVar2;
    if (uVar12 != 0) {
      uVar15 = 2;
      if (2 < maxSymbolValue + 2) {
        uVar15 = (ulong)(maxSymbolValue + 2);
      }
      lVar7 = 0;
      uVar10 = 0;
      uVar17 = (ulong)uVar2;
      do {
        if (normalizedCounter[lVar7] == -1) {
          uVar10 = uVar10 + 1;
          uVar9 = (ulong)((int)uVar17 - 1);
          *(char *)((long)workSpace + uVar17) = (char)lVar7;
        }
        else {
          uVar10 = uVar10 + (int)normalizedCounter[lVar7];
          uVar9 = uVar17;
        }
        uVar8 = (uint)uVar9;
        local_438[lVar7 + 1] = uVar10;
        lVar7 = lVar7 + 1;
        uVar17 = uVar9;
      } while (uVar15 - 1 != lVar7);
    }
    local_438[uVar12] = uVar4 + 1;
    uVar15 = (ulong)(uVar12 + (uVar12 == 0));
    uVar17 = 0;
    uVar12 = 0;
    do {
      sVar1 = normalizedCounter[uVar17];
      if (0 < sVar1) {
        iVar14 = 0;
        do {
          *(char *)((long)workSpace + (ulong)uVar12) = (char)uVar17;
          do {
            uVar12 = uVar12 + (uVar4 >> 3) + (uVar4 >> 1) + 3 & uVar2;
          } while (uVar8 < uVar12);
          iVar14 = iVar14 + 1;
        } while (iVar14 != sVar1);
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != uVar15);
    uVar17 = 0;
    do {
      uVar2 = local_438[*(byte *)((long)workSpace + uVar17)];
      local_438[*(byte *)((long)workSpace + uVar17)] = uVar2 + 1;
      *(short *)((long)ct + (ulong)uVar2 * 2 + 4) = (short)uVar4 + (short)uVar17;
      uVar17 = uVar17 + 1;
    } while (uVar4 != uVar17);
    FVar6 = tableLog * 0x10000 - uVar4;
    sVar5 = 0;
    uVar17 = 0;
    iVar14 = 0;
    do {
      sVar1 = normalizedCounter[uVar17];
      if ((sVar1 == -1) || (sVar1 == 1)) {
        ct[uVar13 + uVar17 * 2 + 2] = FVar6;
        ct[uVar13 + uVar17 * 2 + 1] = iVar14 - 1;
        iVar14 = iVar14 + 1;
      }
      else if (sVar1 == 0) {
        ct[uVar13 + uVar17 * 2 + 2] = FVar6 + 0x10000;
      }
      else {
        iVar16 = (int)sVar1;
        iVar3 = 0x1f;
        if (iVar16 - 1U != 0) {
          for (; iVar16 - 1U >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        FVar11 = iVar14 - iVar16;
        iVar14 = iVar14 + iVar16;
        ct[uVar13 + uVar17 * 2 + 2] =
             (tableLog - iVar3) * 0x10000 - (iVar16 << ((byte)(tableLog - iVar3) & 0x1f));
        ct[uVar13 + uVar17 * 2 + 1] = FVar11;
      }
      uVar17 = uVar17 + 1;
    } while (uVar15 != uVar17);
  }
  return sVar5;
}

Assistant:

size_t FSE_buildCTable_wksp(FSE_CTable* ct,
                      const short* normalizedCounter, unsigned maxSymbolValue, unsigned tableLog,
                            void* workSpace, size_t wkspSize)
{
    U32 const tableSize = 1 << tableLog;
    U32 const tableMask = tableSize - 1;
    void* const ptr = ct;
    U16* const tableU16 = ( (U16*) ptr) + 2;
    void* const FSCT = ((U32*)ptr) + 1 /* header */ + (tableLog ? tableSize>>1 : 1) ;
    FSE_symbolCompressionTransform* const symbolTT = (FSE_symbolCompressionTransform*) (FSCT);
    U32 const step = FSE_TABLESTEP(tableSize);
    U32 cumul[FSE_MAX_SYMBOL_VALUE+2];

    FSE_FUNCTION_TYPE* const tableSymbol = (FSE_FUNCTION_TYPE*)workSpace;
    U32 highThreshold = tableSize-1;

    /* CTable header */
    if (((size_t)1 << tableLog) * sizeof(FSE_FUNCTION_TYPE) > wkspSize) return ERROR(tableLog_tooLarge);
    tableU16[-2] = (U16) tableLog;
    tableU16[-1] = (U16) maxSymbolValue;
    assert(tableLog < 16);   /* required for threshold strategy to work */

    /* For explanations on how to distribute symbol values over the table :
     * http://fastcompression.blogspot.fr/2014/02/fse-distributing-symbol-values.html */

     #ifdef __clang_analyzer__
     memset(tableSymbol, 0, sizeof(*tableSymbol) * tableSize);   /* useless initialization, just to keep scan-build happy */
     #endif

    /* symbol start positions */
    {   U32 u;
        cumul[0] = 0;
        for (u=1; u <= maxSymbolValue+1; u++) {
            if (normalizedCounter[u-1]==-1) {  /* Low proba symbol */
                cumul[u] = cumul[u-1] + 1;
                tableSymbol[highThreshold--] = (FSE_FUNCTION_TYPE)(u-1);
            } else {
                cumul[u] = cumul[u-1] + normalizedCounter[u-1];
        }   }
        cumul[maxSymbolValue+1] = tableSize+1;
    }

    /* Spread symbols */
    {   U32 position = 0;
        U32 symbol;
        for (symbol=0; symbol<=maxSymbolValue; symbol++) {
            int nbOccurences;
            int const freq = normalizedCounter[symbol];
            for (nbOccurences=0; nbOccurences<freq; nbOccurences++) {
                tableSymbol[position] = (FSE_FUNCTION_TYPE)symbol;
                position = (position + step) & tableMask;
                while (position > highThreshold)
                    position = (position + step) & tableMask;   /* Low proba area */
        }   }

        assert(position==0);  /* Must have initialized all positions */
    }

    /* Build table */
    {   U32 u; for (u=0; u<tableSize; u++) {
        FSE_FUNCTION_TYPE s = tableSymbol[u];   /* note : static analyzer may not understand tableSymbol is properly initialized */
        tableU16[cumul[s]++] = (U16) (tableSize+u);   /* TableU16 : sorted by symbol order; gives next state value */
    }   }

    /* Build Symbol Transformation Table */
    {   unsigned total = 0;
        unsigned s;
        for (s=0; s<=maxSymbolValue; s++) {
            switch (normalizedCounter[s])
            {
            case  0:
                /* filling nonetheless, for compatibility with FSE_getMaxNbBits() */
                symbolTT[s].deltaNbBits = ((tableLog+1) << 16) - (1<<tableLog);
                break;

            case -1:
            case  1:
                symbolTT[s].deltaNbBits = (tableLog << 16) - (1<<tableLog);
                symbolTT[s].deltaFindState = total - 1;
                total ++;
                break;
            default :
                {
                    U32 const maxBitsOut = tableLog - BIT_highbit32 (normalizedCounter[s]-1);
                    U32 const minStatePlus = normalizedCounter[s] << maxBitsOut;
                    symbolTT[s].deltaNbBits = (maxBitsOut << 16) - minStatePlus;
                    symbolTT[s].deltaFindState = total - normalizedCounter[s];
                    total +=  normalizedCounter[s];
    }   }   }   }

#if 0  /* debug : symbol costs */
    DEBUGLOG(5, "\n --- table statistics : ");
    {   U32 symbol;
        for (symbol=0; symbol<=maxSymbolValue; symbol++) {
            DEBUGLOG(5, "%3u: w=%3i,   maxBits=%u, fracBits=%.2f",
                symbol, normalizedCounter[symbol],
                FSE_getMaxNbBits(symbolTT, symbol),
                (double)FSE_bitCost(symbolTT, tableLog, symbol, 8) / 256);
        }
    }
#endif

    return 0;
}